

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

int text_sortcompare(void *z1,void *z2,void *zkeyinfo)

{
  int iVar1;
  int local_44;
  int z;
  int count;
  t_keyinfo *k;
  t_atom *a2;
  t_atom *a1;
  void *zkeyinfo_local;
  void *z2_local;
  void *z1_local;
  
  a2 = *z1;
  k = *z2;
  local_44 = *(int *)((long)zkeyinfo + 4);
LAB_001d362c:
  if (local_44 == 0) {
    local_44 = *(int *)((long)zkeyinfo + 4);
    while (local_44 != 0) {
      if ((k->ki_forward == 4) || (k->ki_forward == 5)) {
        return -*zkeyinfo;
      }
      k = k + 2;
      local_44 = local_44 + -1;
    }
    for (; (a2->a_type != A_SEMI && (a2->a_type != A_COMMA)); a2 = a2 + 1) {
      if ((k->ki_forward == 4) || (k->ki_forward == 5)) {
        return *zkeyinfo;
      }
      if (a2->a_type == A_FLOAT) {
        if (k->ki_forward != 1) {
          return -*zkeyinfo;
        }
        if ((a2->a_w).w_float < (float)k[1].ki_forward) {
          return -*zkeyinfo;
        }
        if ((float)k[1].ki_forward <= (a2->a_w).w_float &&
            (a2->a_w).w_float != (float)k[1].ki_forward) {
          return *zkeyinfo;
        }
      }
      else if (a2->a_type == A_SYMBOL) {
        if (k->ki_forward != 2) {
          return *zkeyinfo;
        }
        iVar1 = strcmp(((a2->a_w).w_symbol)->s_name,*(char **)k[1]);
        if (iVar1 != 0) {
          return iVar1 * *zkeyinfo;
        }
      }
      k = k + 2;
    }
    if ((k->ki_forward == 4) || (k->ki_forward == 5)) {
LAB_001d3842:
      if (a2 < k) {
        z1_local._4_4_ = -1;
      }
      else {
        z1_local._4_4_ = 1;
      }
    }
    else {
      z1_local._4_4_ = -*zkeyinfo;
    }
    return z1_local._4_4_;
  }
  if ((a2->a_type != A_SEMI) && (a2->a_type != A_COMMA)) goto LAB_001d36a1;
  local_44 = *(int *)((long)zkeyinfo + 4);
  while( true ) {
    if (local_44 == 0) {
      return -*zkeyinfo;
    }
    if ((k->ki_forward == 4) || (k->ki_forward == 5)) break;
    k = k + 2;
    local_44 = local_44 + -1;
  }
  goto LAB_001d3842;
LAB_001d36a1:
  a2 = a2 + 1;
  local_44 = local_44 + -1;
  goto LAB_001d362c;
}

Assistant:

static int text_sortcompare(const void *z1, const void *z2, void *zkeyinfo)
#endif
{
    const t_atom *a1 = *(t_atom **)z1, *a2 = *(t_atom **)z2;
    t_keyinfo *k = (t_keyinfo *)zkeyinfo;
    int count;
        /* advance first line by key onset and react if we run out early */
    for (count = k->ki_onset; count--; a1++)
    {
        if (a1->a_type == A_SEMI || a1->a_type == A_COMMA)
        {
                /* if second line runs out early too consider them equal */
            for (count = k->ki_onset; count--; a2++)
                if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
                    goto equal;
            return (-k->ki_forward);
        }
    }
    for (count = k->ki_onset; count--; a2++)
        if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
            return (-k->ki_forward);
        /* compare remaining fields */
    for (; ; a1++, a2++)
    {
        if (a1->a_type == A_SEMI || a1->a_type == A_COMMA)
        {
                /* hit end of first line */
            if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
                 goto equal;
            else return (-k->ki_forward);
        }
        else if (a2->a_type == A_SEMI || a2->a_type == A_COMMA)
            return (k->ki_forward); /* hit end of second line */

            /* otherwise if they're different return something, and
            if not proceed to next field */
        else if (a1->a_type == A_FLOAT)
        {
            if (a2->a_type == A_FLOAT)
            {
                if (a1->a_w.w_float < a2->a_w.w_float)
                    return (-k->ki_forward);
                else if (a1->a_w.w_float > a2->a_w.w_float)
                    return (k->ki_forward);
            }
            else return (-k->ki_forward);
        }
        else if (a1->a_type == A_SYMBOL)
        {
            if (a2->a_type == A_SYMBOL)
            {
                int z = strcmp(a1->a_w.w_symbol->s_name,
                    a2->a_w.w_symbol->s_name);
                if (z)
                    return (z * k->ki_forward);
            }
            else return (k->ki_forward);
        }
    }
equal:
    /* ran out of both lines at same time, so we're "equal".
    in this case compare pointers so that "equal" lines (which
    might not be identical because of a nonzero onset) stay in the
    same order as before. */
    if (a1 < a2)
        return (-1);
    else return (1);
}